

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_853dad::HandleRemoveFilenameCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  bool bVar1;
  bool bVar2;
  int iVar3;
  pointer pbVar4;
  string_view value;
  cmCMakePath path;
  string inputPath;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  OutputVariable arguments;
  
  if ((anonymous_namespace)::
      HandleRemoveFilenameCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::parser == '\0') {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 HandleRemoveFilenameCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
    if (iVar3 != 0) {
      ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::
      ArgumentParserWithOutputVariable
                (&HandleRemoveFilenameCommand::parser.
                  super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>);
      __cxa_atexit(CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>::
                   ~CMakePathArgumentParser,&HandleRemoveFilenameCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleRemoveFilenameCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
  }
  ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::Parse<2>
            (&arguments,
             &HandleRemoveFilenameCommand::parser.
              super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>,args);
  bVar1 = ArgumentParser::ParseResult::MaybeReportError
                    (&arguments.super_ParseResult,status->Makefile);
  bVar2 = true;
  if (!bVar1) {
    if (HandleRemoveFilenameCommand::parser.
        super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>.
        super_CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>.Inputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        HandleRemoveFilenameCommand::parser.
        super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>.
        super_CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>.Inputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      inputPath._M_dataplus._M_p = (pointer)&inputPath.field_2;
      inputPath._M_string_length = 0;
      inputPath.field_2._M_local_buf[0] = '\0';
      bVar2 = getInputPath((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1,status,&inputPath);
      if (bVar2) {
        std::__cxx11::string::string((string *)&local_98,(string *)&inputPath);
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>(&path,&local_98,generic_format);
        std::__cxx11::string::~string((string *)&local_98);
        std::filesystem::__cxx11::path::remove_filename();
        this = status->Makefile;
        pbVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::filesystem::__cxx11::path::string(&local_b8,&path.Path);
        pbVar4 = pbVar4 + 1;
        if (arguments.Output.
            super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_engaged != false) {
          pbVar4 = (pointer)&arguments.Output;
        }
        value._M_str = local_b8._M_dataplus._M_p;
        value._M_len = local_b8._M_string_length;
        cmMakefile::AddDefinition(this,pbVar4,value);
        std::__cxx11::string::~string((string *)&local_b8);
        std::filesystem::__cxx11::path::~path(&path.Path);
      }
      std::__cxx11::string::~string((string *)&inputPath);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&path,"REMOVE_FILENAME called with unexpected arguments.",
                 (allocator<char> *)&inputPath);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&path);
      bVar2 = false;
    }
  }
  OutputVariable::~OutputVariable(&arguments);
  return bVar2;
}

Assistant:

bool HandleRemoveFilenameCommand(std::vector<std::string> const& args,
                                 cmExecutionStatus& status)
{
  static OutputVariableParser const parser{};

  const auto arguments = parser.Parse(args);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (!parser.GetInputs().empty()) {
    status.SetError("REMOVE_FILENAME called with unexpected arguments.");
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  cmCMakePath path(inputPath);
  path.RemoveFileName();

  status.GetMakefile().AddDefinition(
    arguments.Output ? *arguments.Output : args[1], path.String());

  return true;
}